

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O2

void __thiscall google::protobuf::json_internal::Mark::Discard(Mark *this)

{
  BufferingGuard local_10;
  
  local_10.owner_ = (ZeroCopyBufferedStream *)0x0;
  BufferingGuard::operator=(&this->guard_,&local_10);
  BufferingGuard::~BufferingGuard(&local_10);
  return;
}

Assistant:

void Discard() && { guard_ = BufferingGuard(); }